

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<anurbs::Polyline<2L>,_std::shared_ptr<anurbs::Polyline<2L>_>_> * __thiscall
pybind11::class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>>::
def<long(anurbs::Polyline<2l>::*)()const>
          (class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>> *this,char *name_,
          offset_in_Model_to_subr *f)

{
  offset_in_Model_to_subr f_00;
  name *extra;
  handle local_c0;
  PyObject *local_b8;
  obj_attr_accessor local_b0;
  offset_in_Model_to_subr local_90;
  handle local_70;
  PyObject *local_68;
  handle local_60;
  handle local_58;
  sibling local_50;
  is_method local_48;
  is_method local_40;
  void *local_38;
  offset_in_Model_to_subr local_30;
  cpp_function local_28;
  cpp_function cf;
  offset_in_Model_to_subr *f_local;
  char *name__local;
  class_<anurbs::Polyline<2L>,_std::shared_ptr<anurbs::Polyline<2L>_>_> *this_local;
  
  local_38 = (void *)*f;
  local_30 = f[1];
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)f;
  f_00 = _anurbs__Polyline<2l>___pybind11__method_adaptor<anurbs::Polyline<2l>,long,anurbs::Polyline<2l>>_long_anurbs__Polyline<2l>______const__
                   (local_38,local_30);
  pybind11::name::name((name *)&local_40,name_);
  is_method::is_method(&local_48,(handle *)this);
  local_60.m_ptr = *(PyObject **)this;
  none::none((none *)&local_70);
  local_68 = local_70.m_ptr;
  getattr((pybind11 *)&local_58,local_60,name_,local_70);
  sibling::sibling(&local_50,&local_58);
  local_90 = f_00;
  cpp_function::
  cpp_function<long,anurbs::Polyline<2l>,,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_28,f_00,extra,&local_40,(sibling *)&local_48);
  pybind11::object::~object((object *)&local_58);
  none::~none((none *)&local_70);
  cpp_function::name((cpp_function *)&local_c0);
  local_b8 = local_c0.m_ptr;
  detail::object_api<pybind11::handle>::attr
            (&local_b0,(object_api<pybind11::handle> *)this,local_c0);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_b0,&local_28);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_b0);
  pybind11::object::~object((object *)&local_c0);
  cpp_function::~cpp_function(&local_28);
  return (class_<anurbs::Polyline<2L>,_std::shared_ptr<anurbs::Polyline<2L>_>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }